

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::V5::
FixedHeaderType<(Protocol::MQTT::Common::ControlPacketType)3,_(unsigned_char)'\x00'>::dump
          (FixedHeaderType<(Protocol::MQTT::Common::ControlPacketType)3,_(unsigned_char)__x00_>
           *this,FastString *out,int indent)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  String local_30;
  int local_1c;
  FastString *pFStack_18;
  int indent_local;
  FastString *out_local;
  FixedHeaderType<(Protocol::MQTT::Common::ControlPacketType)3,_(unsigned_char)__x00_> *this_local;
  
  local_1c = indent;
  pFStack_18 = out;
  out_local = (FastString *)this;
  bVar1 = isRetain(this);
  bVar2 = getQoS(this);
  bVar3 = isDup(this);
  MQTTStringPrintf((char *)&local_30,"%*sHeader: (type PUBLISH, retain %d, QoS %d, dup %d)\n",
                   (ulong)(uint)indent,"",(ulong)bVar1,(ulong)bVar2,(uint)bVar3);
  Bstrlib::String::operator+=(pFStack_18,&local_30);
  Bstrlib::String::~String(&local_30);
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0) { out += MQTTStringPrintf("%*sHeader: (type PUBLISH, retain %d, QoS %d, dup %d)\n", (int)indent, "", isRetain(), getQoS(), isDup()); }